

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

string * bloaty::anon_unknown_34::FixedWidthString
                   (string *__return_storage_ptr__,string *input,size_t size)

{
  string *ret;
  
  if (input->_M_string_length < size) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
    while (__return_storage_ptr__->_M_string_length < size) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)input);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FixedWidthString(const std::string& input, size_t size) {
  if (input.size() < size) {
    std::string ret = input;
    while (ret.size() < size) {
      ret += " ";
    }
    return ret;
  } else {
    return input.substr(0, size);
  }
}